

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ImGuiID id;
  byte *pbVar7;
  byte bVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  char cVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ImGuiTableColumn *pIVar18;
  ulong uVar19;
  ImGuiTableColumn *pIVar20;
  bool bVar21;
  bool bVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  ImRect host_clip_rect;
  int local_9c;
  uint local_88;
  ImRect local_58;
  ImGuiContext *local_48;
  ImRect local_40;
  
  local_48 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x2d2,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  local_88 = table->Flags;
  uVar17 = table->ColumnsCount;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  fVar27 = (local_48->Style).FramePadding.x;
  fVar28 = 1.0;
  if (1.0 <= fVar27) {
    fVar28 = fVar27;
  }
  table->MinColumnWidth = fVar28;
  iVar5 = 0;
  uVar24 = 0xffffffff;
  uVar6 = local_88;
  if ((int)uVar17 < 1) {
    fVar27 = 0.0;
    fVar28 = 0.0;
    bVar21 = false;
    fVar25 = 0.0;
    cVar3 = '\0';
  }
  else {
    uVar16 = 0;
    cVar3 = '\0';
    bVar21 = false;
    local_9c = 0;
    fVar28 = 0.0;
    fVar27 = 0.0;
    do {
      pbVar7 = (byte *)((table->DisplayOrderToIndex).Data + uVar16);
      if ((table->DisplayOrderToIndex).DataEnd <= pbVar7) goto LAB_0018ae4c;
      bVar8 = *pbVar7;
      uVar17 = (uint)(char)bVar8;
      if (uVar16 != uVar17) {
        table->IsDefaultDisplayOrder = false;
      }
      if (((char)bVar8 < '\0') ||
         (pIVar20 = (table->Columns).Data + (char)bVar8, (table->Columns).DataEnd <= pIVar20))
      goto LAB_0018ae35;
      if (table->DeclColumnsCount <= (char)bVar8) {
        TableSetupColumnFlags(table,pIVar20,0);
        pIVar20->NameOffset = -1;
        pIVar20->UserID = 0;
        pIVar20->InitStretchWeightOrWidth = -1.0;
        uVar6 = table->Flags;
      }
      if (((uVar6 & 4) == 0) || ((pIVar20->Flags & 0x40) != 0)) {
        pIVar20->IsEnabledNextFrame = true;
        bVar4 = true;
      }
      else {
        bVar4 = pIVar20->IsEnabledNextFrame;
      }
      if (pIVar20->IsEnabled == bVar4) {
        cVar13 = pIVar20->SortOrder;
      }
      else {
        pIVar20->IsEnabled = bVar4;
        table->IsSettingsDirty = true;
        cVar13 = pIVar20->SortOrder;
        if (cVar13 != -1 && (bVar4 & 1U) == 0) {
          table->IsSortSpecsDirty = true;
        }
      }
      if (((uVar6 >> 0x1a & 1) == 0) && ('\0' < cVar13)) {
        table->IsSortSpecsDirty = true;
      }
      uVar23 = pIVar20->Flags;
      if ((&pIVar20->WidthRequest)[(ulong)((uVar23 & 8) == 0) * 2] <= 0.0 &&
          (&pIVar20->WidthRequest)[(ulong)((uVar23 & 8) == 0) * 2] != 0.0) {
        pIVar20->AutoFitQueue = '\a';
        pIVar20->CannotSkipItemsQueue = '\a';
      }
      if ((bVar4 & 1U) == 0) {
        pIVar20->IndexWithinEnabledSet = -1;
      }
      else {
        pIVar20->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar24;
        pIVar20->NextEnabledColumn = -1;
        if (uVar24 == 0xffffffff) {
          table->LeftMostEnabledColumn = bVar8;
        }
        else {
          if (((int)uVar24 < 0) ||
             (pIVar18 = (table->Columns).Data + (int)uVar24, (table->Columns).DataEnd <= pIVar18))
          goto LAB_0018ae35;
          pIVar18->NextEnabledColumn = bVar8;
        }
        cVar13 = table->ColumnsEnabledCount;
        table->ColumnsEnabledCount = cVar13 + '\x01';
        pIVar20->IndexWithinEnabledSet = cVar13;
        table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar8 & 0x3f);
        bVar8 = pIVar20->DisplayOrder;
        table->EnabledMaskByDisplayOrder = table->EnabledMaskByDisplayOrder | 1L << (bVar8 & 0x3f);
        if ((char)bVar8 < cVar13) {
          __assert_fail("column->IndexWithinEnabledSet <= column->DisplayOrder",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                        ,0x31a,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        if (pIVar20->IsPreserveWidthAuto == false) {
          fVar25 = TableGetColumnWidthAuto(table,pIVar20);
          pIVar20->WidthAuto = fVar25;
        }
        if ((uVar23 & 0x10) == 0) {
          local_9c = 1;
        }
        if ((((uVar23 & 8) != 0) && ((uVar23 & 0x10) != 0)) &&
           (0.0 < pIVar20->InitStretchWeightOrWidth)) {
          pIVar20->WidthAuto = pIVar20->InitStretchWeightOrWidth;
        }
        bVar21 = (bool)(bVar21 | pIVar20->AutoFitQueue != '\0');
        fVar25 = pIVar20->WidthAuto;
        uVar24 = uVar17;
        if ((uVar23 & 4) == 0) {
          fVar27 = (float)((uint)fVar27 & -(uint)(fVar25 <= fVar27) |
                          ~-(uint)(fVar25 <= fVar27) & (uint)fVar25);
          cVar3 = cVar3 + '\x01';
        }
        else {
          fVar28 = fVar28 + fVar25;
          iVar5 = iVar5 + 1;
        }
      }
      uVar16 = uVar16 + 1;
      uVar17 = table->ColumnsCount;
    } while ((long)uVar16 < (long)(int)uVar17);
    fVar25 = (float)iVar5;
    iVar5 = local_9c;
  }
  if ((((uVar6 & 8) != 0) && ((uVar6 >> 0x1b & 1) == 0)) && (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar24;
  if ((table->LeftMostEnabledColumn < '\0') || ((uVar24 & 0x80) != 0)) {
    __assert_fail("table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x338,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  if (bVar21) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  uVar16 = (ulong)uVar17;
  if ((int)uVar17 < 1) {
    fVar26 = 0.0;
    bVar21 = true;
    fVar29 = 0.0;
  }
  else {
    local_88 = local_88 & 0xe000;
    uVar19 = table->EnabledMaskByIndex;
    uVar14 = 0xff;
    lVar12 = 0x62;
    uVar9 = 0;
    uVar15 = 0xff;
    fVar29 = 0.0;
    fVar26 = 0.0;
    do {
      bVar8 = (byte)uVar9;
      if ((uVar19 >> (uVar9 & 0x3f) & 1) != 0) {
        pIVar20 = (table->Columns).Data;
        pIVar18 = (ImGuiTableColumn *)((long)pIVar20 + lVar12 + -0x62);
        if ((table->Columns).DataEnd <= pIVar18) goto LAB_0018ae35;
        uVar24 = pIVar18->Flags;
        if ((uVar24 & 8) == 0) {
          if ((((uVar24 & 0x10) != 0) || (*(char *)((long)&pIVar20->Flags + lVar12) != '\0')) ||
             (fVar30 = *(float *)((long)pIVar20 + lVar12 + -0x4a), fVar30 < 0.0)) {
            fVar30 = *(float *)((long)pIVar20 + lVar12 + -0x46);
            bVar21 = fVar30 <= 0.0;
            if (fVar30 <= 0.0) {
              fVar30 = 1.0;
            }
            if (bVar21 && local_88 == 0x6000) {
              fVar30 = (*(float *)((long)pIVar20 + lVar12 + -0x4e) / fVar28) * fVar25;
            }
            *(float *)((long)pIVar20 + lVar12 + -0x4a) = fVar30;
          }
          cVar13 = (char)uVar15;
          if (cVar13 == -1) {
LAB_0018a498:
            table->LeftMostStretchedColumn = bVar8;
            uVar15 = uVar9 & 0xffffffff;
          }
          else {
            if ((cVar13 < '\0') || ((table->Columns).DataEnd <= pIVar20 + cVar13))
            goto LAB_0018ae35;
            if (*(char *)((long)pIVar20 + lVar12 + -0x10) < pIVar20[cVar13].DisplayOrder)
            goto LAB_0018a498;
          }
          fVar26 = fVar26 + fVar30;
          cVar13 = (char)uVar14;
          if (cVar13 != -1) {
            if ((cVar13 < '\0') || ((table->Columns).DataEnd <= pIVar20 + cVar13))
            goto LAB_0018ae35;
            if (*(char *)((long)pIVar20 + lVar12 + -0x10) <= pIVar20[cVar13].DisplayOrder)
            goto LAB_0018a579;
          }
          table->RightMostStretchedColumn = bVar8;
          uVar14 = uVar9 & 0xffffffff;
        }
        else {
          cVar13 = *(char *)((long)&pIVar20->Flags + lVar12);
          if (local_88 == 0x4000) {
            fVar30 = fVar27;
            if ((uVar24 & 0x10) != 0 || cVar13 != '\0') goto LAB_0018a516;
          }
          else {
            fVar30 = *(float *)((long)pIVar20 + lVar12 + -0x4e);
LAB_0018a516:
            if (cVar13 == '\0') {
              if (((uVar24 & 0x10) != 0) &&
                 ((table->RequestOutputMaskByIndex & 1L << (bVar8 & 0x3f)) != 0)) {
                *(float *)((long)pIVar20 + lVar12 + -0x52) = fVar30;
              }
            }
            else {
              *(float *)((long)pIVar20 + lVar12 + -0x52) = fVar30;
              if (((cVar13 != '\x01') && (table->IsInitializing == true)) &&
                 (*(char *)((long)pIVar20 + lVar12 + -2) == '\0')) {
                fVar31 = table->MinColumnWidth * 4.0;
                uVar24 = -(uint)(fVar31 <= fVar30);
                *(uint *)((long)pIVar20 + lVar12 + -0x52) =
                     ~uVar24 & (uint)fVar31 | (uint)fVar30 & uVar24;
              }
            }
          }
          fVar29 = fVar29 + *(float *)((long)pIVar20 + lVar12 + -0x52);
        }
LAB_0018a579:
        *(undefined1 *)((long)pIVar20 + lVar12 + -2) = 0;
        fVar29 = fVar29 + table->CellPaddingX + table->CellPaddingX;
      }
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + 0x68;
    } while (uVar16 != uVar9);
    bVar21 = (char)uVar15 == -1;
  }
  table->ColumnsEnabledFixedCount = cVar3;
  fVar27 = (table->WorkRect).Min.x;
  fVar28 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((uVar6 >> 0x18 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar25 = (table->WorkRect).Max.x - fVar27;
  }
  else {
    fVar25 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar30 = (table->WorkRect).Min.y;
  fVar29 = (fVar25 - fVar28) - fVar29;
  fVar28 = (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) +
           fVar28;
  table->ColumnsGivenWidth = fVar28;
  fVar25 = fVar29;
  if (0 < (int)uVar17) {
    uVar19 = table->EnabledMaskByIndex;
    lVar12 = 0x55;
    uVar9 = 0;
    do {
      if ((uVar19 >> (uVar9 & 0x3f) & 1) != 0) {
        pIVar20 = (table->Columns).Data;
        pIVar18 = (ImGuiTableColumn *)((long)pIVar20 + lVar12 + -0x55);
        if ((table->Columns).DataEnd <= pIVar18) goto LAB_0018ae35;
        uVar24 = pIVar18->Flags;
        if ((uVar24 & 4) != 0) {
          fVar31 = (*(float *)((long)pIVar20 + lVar12 + -0x3d) / fVar26) * fVar29;
          uVar23 = -(uint)(table->MinColumnWidth <= fVar31);
          fVar31 = (float)(int)((float)(~uVar23 & (uint)table->MinColumnWidth |
                                       (uint)fVar31 & uVar23) + 0.01);
          *(float *)((long)pIVar20 + lVar12 + -0x45) = fVar31;
          fVar25 = fVar25 - fVar31;
        }
        if (*(char *)((long)&pIVar20->Flags + lVar12) == -1 && !bVar21) {
          pIVar18->Flags = uVar24 | 0x40000000;
        }
        fVar31 = *(float *)((long)pIVar20 + lVar12 + -0x45);
        uVar24 = -(uint)(table->MinColumnWidth <= fVar31);
        fVar31 = (float)(int)(float)(~uVar24 & (uint)table->MinColumnWidth | (uint)fVar31 & uVar24);
        *(float *)((long)pIVar20 + lVar12 + -0x51) = fVar31;
        fVar28 = fVar28 + fVar31;
        table->ColumnsGivenWidth = fVar28;
      }
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + 0x68;
    } while (uVar16 != uVar9);
  }
  if ((((uVar6 >> 0x13 & 1) == 0) && (1.0 <= fVar25)) && ((0 < (int)uVar17 && (0.0 < fVar26)))) {
    uVar19 = table->EnabledMaskByDisplayOrder;
    do {
      uVar9 = uVar16 - 1;
      if ((uVar19 >> (uVar9 & 0x3f) & 1) != 0) {
        pcVar10 = (table->DisplayOrderToIndex).Data + uVar9;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar10) goto LAB_0018ae4c;
        lVar12 = (long)*pcVar10;
        if ((lVar12 < 0) ||
           (pIVar20 = (table->Columns).Data + lVar12, (table->Columns).DataEnd <= pIVar20))
        goto LAB_0018ae35;
        if ((pIVar20->Flags & 4) != 0) {
          pIVar20->WidthRequest = pIVar20->WidthRequest + 1.0;
          pIVar20->WidthGiven = pIVar20->WidthGiven + 1.0;
          fVar25 = fVar25 + -1.0;
        }
      }
    } while ((1.0 <= fVar25) && (bVar21 = 1 < uVar16, uVar16 = uVar9, bVar21));
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar28 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar25 = local_40.Min.y + table->LastOuterHeight;
  uVar17 = -(uint)(fVar25 <= fVar28);
  local_40.Max.y = (float)(uVar17 & (uint)fVar28 | ~uVar17 & (uint)fVar25);
  bVar4 = ItemHoverable(&local_40,0);
  bVar21 = '\0' < table->FreezeColumnsCount;
  fVar28 = fVar27;
  if ('\0' < table->FreezeColumnsCount) {
    fVar28 = (table->OuterRect).Min.x;
  }
  local_58.Min = (table->InnerClipRect).Min;
  local_58.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar16 = (ulong)(uint)table->ColumnsCount;
  if (table->ColumnsCount < 1) {
LAB_0018ac51:
    if ((-1 < (long)table->RightMostEnabledColumn) &&
       (pIVar20 = (table->Columns).Data + table->RightMostEnabledColumn,
       pIVar20 < (table->Columns).DataEnd)) {
      fVar27 = (table->WorkRect).Min.x;
      fVar28 = (pIVar20->ClipRect).Max.x;
      uVar17 = -(uint)(fVar28 <= fVar27);
      fVar27 = (float)(~uVar17 & (uint)fVar28 | (uint)fVar27 & uVar17);
      if ((bVar4) && ((table->HoveredColumnBody == -1 && (fVar27 <= (local_48->IO).MousePos.x)))) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)uVar16;
      }
      uVar17 = table->Flags;
      if ((char)iVar5 == '\0' && (uVar17 & 1) != 0) {
        uVar17 = uVar17 & 0xfffffffe;
        table->Flags = uVar17;
      }
      if (table->RightMostStretchedColumn != -1) {
        uVar17 = uVar17 & 0xfffeffff;
        table->Flags = uVar17;
      }
      if ((uVar17 >> 0x10 & 1) != 0) {
        (table->WorkRect).Max.x = fVar27;
        (table->OuterRect).Max.x = fVar27;
        fVar28 = (table->InnerClipRect).Max.x;
        if (fVar27 <= fVar28) {
          fVar28 = fVar27;
        }
        (table->InnerClipRect).Max.x = fVar28;
      }
      pIVar1 = table->InnerWindow;
      IVar2 = (table->WorkRect).Max;
      (pIVar1->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar1->ParentWorkRect).Max = IVar2;
      fVar27 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar27;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar21 = BeginPopupEx(id,0x141);
        if (bVar21) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      uVar17 = table->Flags;
      if (((byte)((uVar17 & 8) >> 3) & table->IsSortSpecsDirty) == 1) {
        TableSortSpecsBuild(table);
        uVar17 = table->Flags;
      }
      pIVar1 = table->InnerWindow;
      if ((uVar17 >> 0x14 & 1) == 0) {
        ImDrawList::PushClipRect
                  (pIVar1->DrawList,(pIVar1->ClipRect).Min,(pIVar1->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar1->DrawList,2);
      }
      return;
    }
LAB_0018ae35:
    pcVar10 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
  }
  else {
    fVar28 = (fVar28 + table->OuterPaddingX) - table->CellSpacingX1;
    uVar19 = 0;
    iVar11 = 0;
    while (pbVar7 = (byte *)((table->DisplayOrderToIndex).Data + uVar19),
          pbVar7 < (table->DisplayOrderToIndex).DataEnd) {
      bVar8 = *pbVar7;
      if (((long)(char)bVar8 < 0) ||
         (pIVar20 = (table->Columns).Data + (char)bVar8, (table->Columns).DataEnd <= pIVar20))
      goto LAB_0018ae35;
      bVar22 = true;
      if (table->FreezeRowsCount < '\x01') {
        bVar22 = (char)bVar8 < table->FreezeColumnsCount;
      }
      pIVar20->NavLayerCurrent = bVar22;
      if (bVar21) {
        bVar21 = true;
        if (iVar11 == table->FreezeColumnsCount) {
          fVar28 = fVar28 + (fVar27 - (table->OuterRect).Min.x);
          goto LAB_0018a954;
        }
      }
      else {
LAB_0018a954:
        bVar21 = false;
      }
      pbVar7 = (byte *)((long)&pIVar20->Flags + 2);
      *pbVar7 = *pbVar7 & 0xf;
      if ((table->EnabledMaskByDisplayOrder >> (uVar19 & 0x3f) & 1) == 0) {
        (pIVar20->ClipRect).Max.x = fVar28;
        (pIVar20->ClipRect).Min.x = fVar28;
        pIVar20->WorkMinX = fVar28;
        pIVar20->MaxX = fVar28;
        pIVar20->MinX = fVar28;
        pIVar20->WidthGiven = 0.0;
        (pIVar20->ClipRect).Min.y = fVar30;
        (pIVar20->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar20->ClipRect,&local_58);
        pIVar20->IsVisibleX = false;
        pIVar20->IsVisibleY = false;
        pIVar20->IsRequestOutput = false;
        pIVar20->IsSkipItems = true;
        pIVar20->ItemWidth = 1.0;
      }
      else {
        if (((bVar4) && (fVar25 = (local_48->IO).MousePos.x, (pIVar20->ClipRect).Min.x <= fVar25))
           && (fVar25 < (pIVar20->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar8;
        }
        pIVar20->MinX = fVar28;
        fVar26 = TableGetMaxColumnWidth(table,(int)(char)bVar8);
        fVar25 = pIVar20->WidthGiven;
        if (fVar26 <= pIVar20->WidthGiven) {
          fVar25 = fVar26;
        }
        fVar26 = pIVar20->WidthRequest;
        if (table->MinColumnWidth <= pIVar20->WidthRequest) {
          fVar26 = table->MinColumnWidth;
        }
        fVar31 = (float)(~-(uint)(fVar26 <= fVar25) & (uint)fVar26 |
                        (uint)fVar25 & -(uint)(fVar26 <= fVar25));
        pIVar20->WidthGiven = fVar31;
        fVar25 = table->CellPaddingX;
        fVar26 = table->CellSpacingX1;
        fVar29 = table->CellSpacingX2;
        fVar32 = fVar25 + fVar25 + fVar31 + fVar28 + fVar26 + fVar29;
        pIVar20->MaxX = fVar32;
        pIVar20->WorkMinX = fVar25 + pIVar20->MinX + fVar26;
        pIVar20->WorkMaxX = (fVar32 - fVar25) - fVar29;
        pIVar20->ItemWidth = (float)(int)(fVar31 * 0.65);
        (pIVar20->ClipRect).Min.x = pIVar20->MinX;
        (pIVar20->ClipRect).Min.y = fVar30;
        (pIVar20->ClipRect).Max.x = fVar32;
        (pIVar20->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar20->ClipRect,&local_58);
        fVar25 = (pIVar20->ClipRect).Min.x;
        fVar26 = (pIVar20->ClipRect).Max.x;
        pIVar20->IsVisibleX = fVar25 < fVar26;
        pIVar20->IsVisibleY = true;
        if (fVar26 <= fVar25) {
          if (pIVar20->AutoFitQueue != '\0') goto LAB_0018ab21;
          bVar22 = pIVar20->CannotSkipItemsQueue != '\0';
          pIVar20->IsRequestOutput = bVar22;
          if (bVar22) goto LAB_0018ab2c;
        }
        else {
          table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar8 & 0x3f);
LAB_0018ab21:
          pIVar20->IsRequestOutput = true;
LAB_0018ab2c:
          table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar8 & 0x3f);
        }
        bVar22 = true;
        if (pIVar20->IsEnabled == true) {
          bVar22 = table->HostSkipItems;
        }
        pIVar20->IsSkipItems = bVar22;
        if (bVar22 == true && fVar25 < fVar26) {
          __assert_fail("!is_visible",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                        ,0x408,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        uVar17 = (uint)(fVar25 < fVar26) << 0x15 | pIVar20->Flags;
        uVar6 = uVar17 | 0x100000;
        pIVar20->Flags = uVar6;
        if (pIVar20->SortOrder != -1) {
          uVar6 = uVar17 | 0x500000;
          pIVar20->Flags = uVar6;
        }
        if (table->HoveredColumnBody == bVar8) {
          pIVar20->Flags = uVar6 | 0x800000;
        }
        fVar25 = pIVar20->WorkMinX;
        pIVar20->ContentMaxXFrozen = fVar25;
        pIVar20->ContentMaxXUnfrozen = fVar25;
        pIVar20->ContentMaxXHeadersUsed = fVar25;
        pIVar20->ContentMaxXHeadersIdeal = fVar25;
        if (table->HostSkipItems == false) {
          pIVar20->AutoFitQueue = pIVar20->AutoFitQueue >> 1;
          pIVar20->CannotSkipItemsQueue = pIVar20->CannotSkipItemsQueue >> 1;
        }
        if (iVar11 < table->FreezeColumnsCount) {
          fVar26 = pIVar20->MaxX + 1.0;
          fVar25 = local_58.Max.x;
          if (fVar26 <= local_58.Max.x) {
            fVar25 = fVar26;
          }
          local_58.Min.x =
               (float)(-(uint)(fVar26 < local_58.Min.x) & (uint)local_58.Min.x |
                      ~-(uint)(fVar26 < local_58.Min.x) & (uint)fVar25);
        }
        fVar28 = fVar28 + table->CellPaddingX + table->CellPaddingX +
                          pIVar20->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
        iVar11 = iVar11 + 1;
      }
      uVar19 = uVar19 + 1;
      uVar16 = (ulong)table->ColumnsCount;
      if ((long)uVar16 <= (long)uVar19) goto LAB_0018ac51;
    }
LAB_0018ae4c:
    pcVar10 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                ,0x23b,pcVar10);
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings/sortspecs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsEnabledNextFrame = true;
        if (column->IsEnabled != column->IsEnabledNextFrame)
        {
            column->IsEnabled = column->IsEnabledNextFrame;
            table->IsSettingsDirty = true;
            if (!column->IsEnabled && column->SortOrder != -1)
                table->IsSortSpecsDirty = true;
        }
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto;

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter->SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}